

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O1

mz_bool mz_zip_writer_add_to_central_dir
                  (mz_zip_archive *pZip,char *pFilename,mz_uint16 filename_size,void *pExtra,
                  mz_uint16 extra_size,void *pComment,mz_uint16 comment_size,mz_uint64 uncomp_size,
                  mz_uint64 comp_size,mz_uint32 uncomp_crc32,mz_uint16 method,mz_uint16 bit_flags,
                  mz_uint16 dos_time,mz_uint16 dos_date,mz_uint64 param_15,mz_uint32 ext_attributes)

{
  mz_zip_internal_state *pArray;
  size_t sVar1;
  mz_bool mVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined2 in_register_00000082;
  size_t orig_size;
  undefined6 in_stack_0000000a;
  uint6 in_stack_00000032;
  undefined2 in_stack_0000003a;
  mz_uint32 central_dir_ofs;
  undefined4 local_88;
  undefined2 uStack_84;
  undefined1 uStack_82;
  undefined1 uStack_81;
  undefined1 uStack_80;
  undefined1 uStack_7f;
  undefined1 uStack_7e;
  undefined1 uStack_7d;
  undefined1 uStack_7c;
  undefined1 uStack_7b;
  mz_uint16 mStack_7a;
  undefined4 local_78;
  undefined1 uStack_74;
  undefined1 uStack_73;
  undefined1 uStack_72;
  undefined1 uStack_71;
  undefined1 uStack_70;
  undefined1 uStack_6f;
  undefined1 uStack_6e;
  undefined1 uStack_6d;
  mz_uint16 mStack_6c;
  undefined2 uStack_6a;
  mz_uint16 local_68;
  undefined4 uStack_66;
  mz_uint16 local_62;
  undefined1 local_60;
  undefined1 local_5f;
  undefined1 local_5e;
  undefined1 local_5d;
  undefined1 local_5c;
  undefined1 local_5b;
  undefined4 local_50;
  undefined4 local_4c;
  ulong local_48;
  void *local_40;
  char *local_38;
  
  local_50 = CONCAT22(in_register_00000082,extra_size);
  pArray = pZip->m_pState;
  uVar5 = (pArray->m_central_dir).m_size;
  local_4c = (undefined4)uVar5;
  if (in_stack_00000032 >> 0x10 != 0) {
    return 0;
  }
  uVar4 = (ulong)filename_size;
  local_48 = (ulong)extra_size;
  if (local_48 + uVar4 + uVar5 + 0x2e >> 0x20 != 0) {
    return 0;
  }
  uStack_66 = 0;
  local_88 = 0x2014b50;
  uStack_84 = 0x35b;
  uStack_82 = 0x14;
  if ((short)comp_size == 0) {
    uStack_82 = 0;
  }
  uStack_81 = 0;
  uStack_80 = 0;
  uStack_7f = 0;
  uStack_7e = (undefined1)comp_size;
  uStack_7d = (undefined1)(comp_size >> 8);
  uStack_7c = (undefined1)uncomp_crc32;
  uStack_7b = (undefined1)(uncomp_crc32 >> 8);
  _local_78 = CONCAT17((char)((uint6)in_stack_0000000a >> 8),
                       CONCAT16((char)in_stack_0000000a,
                                CONCAT15((char)(comment_size >> 8),
                                         CONCAT14((char)comment_size,(undefined4)uncomp_size))));
  uStack_70 = SUB81(pComment,0);
  uStack_6f = (undefined1)((ulong)pComment >> 8);
  uStack_6e = (undefined1)((ulong)pComment >> 0x10);
  uStack_6d = (undefined1)((ulong)pComment >> 0x18);
  uStack_6a = 0;
  _local_62 = CONCAT17((char)(in_stack_00000032 >> 8),
                       CONCAT16((char)in_stack_00000032,
                                CONCAT15((char)(bit_flags >> 8),
                                         CONCAT14((char)bit_flags,
                                                  CONCAT13((char)((ushort)in_stack_0000003a >> 8),
                                                           CONCAT12((char)in_stack_0000003a,dos_time
                                                                   ))))));
  uVar3 = uVar5 + 0x2e;
  local_40 = pExtra;
  local_38 = pFilename;
  mStack_6c = filename_size;
  if ((pArray->m_central_dir).m_capacity < uVar3) {
    mStack_7a = method;
    local_68 = extra_size;
    mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar3,1);
    extra_size = local_68;
    method = mStack_7a;
    if (mVar2 != 0) goto LAB_006f7971;
LAB_006f7a9a:
    if ((pArray->m_central_dir).m_capacity < uVar5) {
      mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar5,0);
      if (mVar2 == 0) {
        return 0;
      }
    }
    (pArray->m_central_dir).m_size = uVar5;
    mVar2 = 0;
  }
  else {
LAB_006f7971:
    (pArray->m_central_dir).m_size = uVar3;
    uVar3 = (ulong)(pArray->m_central_dir).m_element_size;
    local_68 = extra_size;
    mStack_7a = method;
    memcpy((void *)(uVar5 * uVar3 + (long)(pArray->m_central_dir).m_p),&local_88,uVar3 * 0x2e);
    if (filename_size != 0) {
      if (local_38 == (char *)0x0) goto LAB_006f7a9a;
      sVar1 = (pArray->m_central_dir).m_size;
      uVar3 = uVar4 + sVar1;
      if ((pArray->m_central_dir).m_capacity < uVar3) {
        mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar3,1);
        if (mVar2 == 0) goto LAB_006f7a9a;
      }
      (pArray->m_central_dir).m_size = uVar3;
      uVar3 = (ulong)(pArray->m_central_dir).m_element_size;
      memcpy((void *)(sVar1 * uVar3 + (long)(pArray->m_central_dir).m_p),local_38,uVar4 * uVar3);
    }
    if ((short)local_50 != 0) {
      if (local_40 == (void *)0x0) goto LAB_006f7a9a;
      sVar1 = (pArray->m_central_dir).m_size;
      uVar4 = sVar1 + local_48;
      if ((pArray->m_central_dir).m_capacity < uVar4) {
        mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar4,1);
        if (mVar2 == 0) goto LAB_006f7a9a;
      }
      (pArray->m_central_dir).m_size = uVar4;
      uVar4 = (ulong)(pArray->m_central_dir).m_element_size;
      memcpy((void *)(sVar1 * uVar4 + (long)(pArray->m_central_dir).m_p),local_40,local_48 * uVar4);
    }
    sVar1 = (pArray->m_central_dir_offsets).m_size;
    uVar4 = sVar1 + 1;
    if ((pArray->m_central_dir_offsets).m_capacity < uVar4) {
      mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar4,1);
      if (mVar2 == 0) goto LAB_006f7a9a;
    }
    (pArray->m_central_dir_offsets).m_size = uVar4;
    uVar5 = (ulong)(pArray->m_central_dir_offsets).m_element_size;
    memcpy((void *)(sVar1 * uVar5 + (long)(pArray->m_central_dir_offsets).m_p),&local_4c,uVar5);
    mVar2 = 1;
  }
  return mVar2;
}

Assistant:

static mz_bool mz_zip_writer_add_to_central_dir(
    mz_zip_archive *pZip, const char *pFilename, mz_uint16 filename_size,
    const void *pExtra, mz_uint16 extra_size, const void *pComment,
    mz_uint16 comment_size, mz_uint64 uncomp_size, mz_uint64 comp_size,
    mz_uint32 uncomp_crc32, mz_uint16 method, mz_uint16 bit_flags,
    mz_uint16 dos_time, mz_uint16 dos_date, mz_uint64 local_header_ofs,
    mz_uint32 ext_attributes) {
  mz_zip_internal_state *pState = pZip->m_pState;
  mz_uint32 central_dir_ofs = (mz_uint32)pState->m_central_dir.m_size;
  size_t orig_central_dir_size = pState->m_central_dir.m_size;
  mz_uint8 central_dir_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];

  // No zip64 support yet
  if ((local_header_ofs > 0xFFFFFFFF) ||
      (((mz_uint64)pState->m_central_dir.m_size +
        MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size + extra_size +
        comment_size) > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_writer_create_central_dir_header(
          pZip, central_dir_header, filename_size, extra_size, comment_size,
          uncomp_size, comp_size, uncomp_crc32, method, bit_flags, dos_time,
          dos_date, local_header_ofs, ext_attributes))
    return MZ_FALSE;

  if ((!mz_zip_array_push_back(pZip, &pState->m_central_dir, central_dir_header,
                               MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pFilename,
                               filename_size)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pExtra,
                               extra_size)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pComment,
                               comment_size)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets,
                               &central_dir_ofs, 1))) {
    // Try to push the central directory array back into its original state.
    mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size,
                        MZ_FALSE);
    return MZ_FALSE;
  }

  return MZ_TRUE;
}